

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O0

void __thiscall
HighsLpRelaxation::HighsLpRelaxation(HighsLpRelaxation *this,HighsLpRelaxation *other)

{
  HighsInt HVar1;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  HighsLp *in_stack_00000328;
  Highs *in_stack_00000330;
  undefined7 in_stack_fffffffffffffb28;
  undefined1 in_stack_fffffffffffffb2f;
  HighsOptions *in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb3c;
  undefined4 in_stack_fffffffffffffb48;
  allocator *paVar2;
  vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
  *in_stack_fffffffffffffb78;
  vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
  *in_stack_fffffffffffffb80;
  HighsLp *pHVar3;
  HighsLp *this_00;
  Highs *in_stack_fffffffffffffbd0;
  allocator local_401;
  string local_400 [104];
  string *in_stack_fffffffffffffc68;
  HighsBasis *in_stack_fffffffffffffc70;
  Highs *in_stack_fffffffffffffc78;
  allocator local_41;
  string local_40 [48];
  undefined8 *local_10;
  
  *in_RDI = *in_RSI;
  local_10 = in_RSI;
  Highs::Highs(in_stack_fffffffffffffbd0);
  std::vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>::vector
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
            ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
             in_stack_fffffffffffffb80,
             (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
             in_stack_fffffffffffffb78);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x603839);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x603852);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x60386b);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x603884);
  pHVar3 = (HighsLp *)(in_RDI + 0xa4b);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x6038a0);
  this_00 = (HighsLp *)(in_RDI + 0xa4e);
  HVectorBase<double>::HVectorBase((HVectorBase<double> *)in_stack_fffffffffffffb30);
  HighsSparseVectorSum::HighsSparseVectorSum((HighsSparseVectorSum *)in_stack_fffffffffffffb30);
  in_RDI[0xa6c] = local_10[0xa6c];
  std::shared_ptr<const_HighsBasis>::shared_ptr
            ((shared_ptr<const_HighsBasis> *)in_stack_fffffffffffffb30,
             (shared_ptr<const_HighsBasis> *)
             CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28));
  *(byte *)(in_RDI + 0xa6f) = *(byte *)(local_10 + 0xa6f) & 1;
  *(byte *)(in_RDI + 0xa76) = *(byte *)(local_10 + 0xa76) & 1;
  paVar2 = &local_41;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"output_flag",paVar2);
  Highs::setOptionValue
            ((Highs *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
             (string *)in_stack_fffffffffffffb30,(bool)in_stack_fffffffffffffb2f);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  Highs::getOptions((Highs *)(local_10 + 1));
  Highs::passOptions((Highs *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                     in_stack_fffffffffffffb30);
  Highs::getLp((Highs *)(local_10 + 1));
  HighsLp::HighsLp(this_00,pHVar3);
  Highs::passModel(in_stack_00000330,in_stack_00000328);
  HighsLp::~HighsLp((HighsLp *)in_stack_fffffffffffffb30);
  Highs::getBasis((Highs *)(local_10 + 1));
  paVar2 = &local_401;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_400,"",paVar2);
  Highs::setBasis(in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  std::__cxx11::string::~string(local_400);
  std::allocator<char>::~allocator((allocator<char> *)&local_401);
  HVar1 = HighsMipSolver::numCol((HighsMipSolver *)*in_RDI);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)paVar2,
             CONCAT44(HVar1,in_stack_fffffffffffffb48));
  HighsMipSolver::numCol((HighsMipSolver *)*in_RDI);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)paVar2,
             CONCAT44(HVar1,in_stack_fffffffffffffb48));
  *(undefined4 *)((long)in_RDI + 0x53ac) = 0;
  in_RDI[0xa70] = 0;
  in_RDI[0xa72] = 0;
  in_RDI[0xa73] = 0;
  in_RDI[0xa74] = 0;
  *(undefined4 *)(in_RDI + 0xa75) = 0;
  in_RDI[0xa71] = 0;
  in_RDI[0xa6c] = 0xfff0000000000000;
  *(undefined4 *)(in_RDI + 0xa4e) = 0;
  return;
}

Assistant:

HighsLpRelaxation::HighsLpRelaxation(const HighsLpRelaxation& other)
    : mipsolver(other.mipsolver),
      lprows(other.lprows),
      fractionalints(other.fractionalints),
      objective(other.objective),
      basischeckpoint(other.basischeckpoint),
      currentbasisstored(other.currentbasisstored),
      adjustSymBranchingCol(other.adjustSymBranchingCol) {
  lpsolver.setOptionValue("output_flag", false);
  lpsolver.passOptions(other.lpsolver.getOptions());
  lpsolver.passModel(other.lpsolver.getLp());
  lpsolver.setBasis(other.lpsolver.getBasis());
  colLbBuffer.resize(mipsolver.numCol());
  colUbBuffer.resize(mipsolver.numCol());
  status = Status::kNotSet;
  numlpiters = 0;
  avgSolveIters = 0;
  numSolved = 0;
  epochs = 0;
  maxNumFractional = 0;
  lastAgeCall = 0;
  objective = -kHighsInf;
  row_ep.size = 0;
}